

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leccalc.cpp
# Opt level: O0

bool operator<(outkey2 *lhs,outkey2 *rhs)

{
  outkey2 *rhs_local;
  outkey2 *lhs_local;
  
  if (lhs->period_no == rhs->period_no) {
    if (lhs->sidx == rhs->sidx) {
      lhs_local._7_1_ = lhs->summary_id < rhs->summary_id;
    }
    else {
      lhs_local._7_1_ = lhs->sidx < rhs->sidx;
    }
  }
  else {
    lhs_local._7_1_ = lhs->period_no < rhs->period_no;
  }
  return lhs_local._7_1_;
}

Assistant:

bool operator<(const outkey2& lhs, const outkey2& rhs)
{
	if (lhs.period_no != rhs.period_no) {
		return lhs.period_no < rhs.period_no;
	}
	if (lhs.sidx != rhs.sidx) {
		return lhs.sidx < rhs.sidx;
	}
	else {
		return lhs.summary_id < rhs.summary_id;
	}
}